

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterStep4(char *aBuf,int *pnBuf)

{
  int iVar1;
  int iVar2;
  char *zStem;
  int *in_RSI;
  long in_RDI;
  int nBuf;
  int ret;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  iVar1 = *in_RSI;
  zStem = (char *)(ulong)((int)*(char *)(in_RDI + (iVar1 + -2)) - 0x61);
  switch(zStem) {
  case (char *)0x0:
    if (((2 < iVar1) && (iVar2 = memcmp("al",(void *)(in_RDI + (iVar1 + -2)),2), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),0), iVar2 != 0)) {
      *in_RSI = iVar1 + -2;
    }
    break;
  case (char *)0x2:
    if ((iVar1 < 5) || (iVar2 = memcmp("ance",(void *)(in_RDI + (iVar1 + -4)),4), iVar2 != 0)) {
      if ((4 < iVar1) &&
         ((iVar2 = memcmp("ence",(void *)(in_RDI + (iVar1 + -4)),4), iVar2 == 0 &&
          (iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                    in_stack_ffffffffffffffd8),0), iVar2 != 0)))) {
        *in_RSI = iVar1 + -4;
      }
    }
    else {
      iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              0);
      if (iVar2 != 0) {
        *in_RSI = iVar1 + -4;
      }
    }
    break;
  case (char *)0x4:
    if (((2 < iVar1) && (iVar2 = memcmp("er",(void *)(in_RDI + (iVar1 + -2)),2), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),0), iVar2 != 0)) {
      *in_RSI = iVar1 + -2;
    }
    break;
  case (char *)0x8:
    if (((2 < iVar1) && (iVar2 = memcmp("ic",(void *)(in_RDI + (iVar1 + -2)),2), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),0), iVar2 != 0)) {
      *in_RSI = iVar1 + -2;
    }
    break;
  case (char *)0xb:
    if ((iVar1 < 5) || (iVar2 = memcmp("able",(void *)(in_RDI + (iVar1 + -4)),4), iVar2 != 0)) {
      if ((4 < iVar1) &&
         ((iVar2 = memcmp("ible",(void *)(in_RDI + (iVar1 + -4)),4), iVar2 == 0 &&
          (iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                    in_stack_ffffffffffffffd8),0), iVar2 != 0)))) {
        *in_RSI = iVar1 + -4;
      }
    }
    else {
      iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              0);
      if (iVar2 != 0) {
        *in_RSI = iVar1 + -4;
      }
    }
    break;
  case (char *)0xd:
    if ((iVar1 < 4) || (iVar2 = memcmp("ant",(void *)(in_RDI + (iVar1 + -3)),3), iVar2 != 0)) {
      if ((iVar1 < 6) || (iVar2 = memcmp("ement",(void *)(in_RDI + (iVar1 + -5)),5), iVar2 != 0)) {
        if ((iVar1 < 5) || (iVar2 = memcmp("ment",(void *)(in_RDI + (iVar1 + -4)),4), iVar2 != 0)) {
          if ((3 < iVar1) &&
             ((iVar2 = memcmp("ent",(void *)(in_RDI + (iVar1 + -3)),3), iVar2 == 0 &&
              (iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                        in_stack_ffffffffffffffd8),0), iVar2 != 0)))
             ) {
            *in_RSI = iVar1 + -3;
          }
        }
        else {
          iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                   in_stack_ffffffffffffffd8),0);
          if (iVar2 != 0) {
            *in_RSI = iVar1 + -4;
          }
        }
      }
      else {
        iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),0);
        if (iVar2 != 0) {
          *in_RSI = iVar1 + -5;
        }
      }
    }
    else {
      iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              0);
      if (iVar2 != 0) {
        *in_RSI = iVar1 + -3;
      }
    }
    break;
  case (char *)0xe:
    if ((iVar1 < 4) || (iVar2 = memcmp("ion",(void *)(in_RDI + (iVar1 + -3)),3), iVar2 != 0)) {
      if ((2 < iVar1) &&
         ((iVar2 = memcmp("ou",(void *)(in_RDI + (iVar1 + -2)),2), iVar2 == 0 &&
          (iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                    in_stack_ffffffffffffffd8),0), iVar2 != 0)))) {
        *in_RSI = iVar1 + -2;
      }
    }
    else {
      iVar2 = fts5Porter_MGt1_and_S_or_T(zStem,in_stack_ffffffffffffffdc);
      if (iVar2 != 0) {
        *in_RSI = iVar1 + -3;
      }
    }
    break;
  case (char *)0x12:
    if (((3 < iVar1) && (iVar2 = memcmp("ism",(void *)(in_RDI + (iVar1 + -3)),3), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),0), iVar2 != 0)) {
      *in_RSI = iVar1 + -3;
    }
    break;
  case (char *)0x13:
    if ((iVar1 < 4) || (iVar2 = memcmp("ate",(void *)(in_RDI + (iVar1 + -3)),3), iVar2 != 0)) {
      if ((3 < iVar1) &&
         ((iVar2 = memcmp("iti",(void *)(in_RDI + (iVar1 + -3)),3), iVar2 == 0 &&
          (iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                    in_stack_ffffffffffffffd8),0), iVar2 != 0)))) {
        *in_RSI = iVar1 + -3;
      }
    }
    else {
      iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              0);
      if (iVar2 != 0) {
        *in_RSI = iVar1 + -3;
      }
    }
    break;
  case (char *)0x14:
    if (((3 < iVar1) && (iVar2 = memcmp("ous",(void *)(in_RDI + (iVar1 + -3)),3), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),0), iVar2 != 0)) {
      *in_RSI = iVar1 + -3;
    }
    break;
  case (char *)0x15:
    if (((3 < iVar1) && (iVar2 = memcmp("ive",(void *)(in_RDI + (iVar1 + -3)),3), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),0), iVar2 != 0)) {
      *in_RSI = iVar1 + -3;
    }
    break;
  case (char *)0x19:
    if (((3 < iVar1) && (iVar2 = memcmp("ize",(void *)(in_RDI + (iVar1 + -3)),3), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),0), iVar2 != 0)) {
      *in_RSI = iVar1 + -3;
    }
  }
  return 0;
}

Assistant:

static int fts5PorterStep4(char *aBuf, int *pnBuf){
  int ret = 0;
  int nBuf = *pnBuf;
  switch( aBuf[nBuf-2] ){

    case 'a':
      if( nBuf>2 && 0==memcmp("al", &aBuf[nBuf-2], 2) ){
        if( fts5Porter_MGt1(aBuf, nBuf-2) ){
          *pnBuf = nBuf - 2;
        }
      }
      break;

    case 'c':
      if( nBuf>4 && 0==memcmp("ance", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt1(aBuf, nBuf-4) ){
          *pnBuf = nBuf - 4;
        }
      }else if( nBuf>4 && 0==memcmp("ence", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt1(aBuf, nBuf-4) ){
          *pnBuf = nBuf - 4;
        }
      }
      break;

    case 'e':
      if( nBuf>2 && 0==memcmp("er", &aBuf[nBuf-2], 2) ){
        if( fts5Porter_MGt1(aBuf, nBuf-2) ){
          *pnBuf = nBuf - 2;
        }
      }
      break;

    case 'i':
      if( nBuf>2 && 0==memcmp("ic", &aBuf[nBuf-2], 2) ){
        if( fts5Porter_MGt1(aBuf, nBuf-2) ){
          *pnBuf = nBuf - 2;
        }
      }
      break;

    case 'l':
      if( nBuf>4 && 0==memcmp("able", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt1(aBuf, nBuf-4) ){
          *pnBuf = nBuf - 4;
        }
      }else if( nBuf>4 && 0==memcmp("ible", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt1(aBuf, nBuf-4) ){
          *pnBuf = nBuf - 4;
        }
      }
      break;

    case 'n':
      if( nBuf>3 && 0==memcmp("ant", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }else if( nBuf>5 && 0==memcmp("ement", &aBuf[nBuf-5], 5) ){
        if( fts5Porter_MGt1(aBuf, nBuf-5) ){
          *pnBuf = nBuf - 5;
        }
      }else if( nBuf>4 && 0==memcmp("ment", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt1(aBuf, nBuf-4) ){
          *pnBuf = nBuf - 4;
        }
      }else if( nBuf>3 && 0==memcmp("ent", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;

    case 'o':
      if( nBuf>3 && 0==memcmp("ion", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1_and_S_or_T(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }else if( nBuf>2 && 0==memcmp("ou", &aBuf[nBuf-2], 2) ){
        if( fts5Porter_MGt1(aBuf, nBuf-2) ){
          *pnBuf = nBuf - 2;
        }
      }
      break;

    case 's':
      if( nBuf>3 && 0==memcmp("ism", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;

    case 't':
      if( nBuf>3 && 0==memcmp("ate", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }else if( nBuf>3 && 0==memcmp("iti", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;

    case 'u':
      if( nBuf>3 && 0==memcmp("ous", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;

    case 'v':
      if( nBuf>3 && 0==memcmp("ive", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;

    case 'z':
      if( nBuf>3 && 0==memcmp("ize", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;

  }
  return ret;
}